

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_ecdsa_recoverable_signature_convert
              (secp256k1_context *ctx,secp256k1_ecdsa_signature *sig,
              secp256k1_ecdsa_recoverable_signature *sigin)

{
  int local_6c;
  undefined1 local_68 [4];
  int recid;
  secp256k1_scalar s;
  secp256k1_scalar r;
  secp256k1_ecdsa_recoverable_signature *sigin_local;
  secp256k1_ecdsa_signature *sig_local;
  secp256k1_context *ctx_local;
  
  if (sig == (secp256k1_ecdsa_signature *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"sig != NULL");
    ctx_local._4_4_ = 0;
  }
  else if (sigin == (secp256k1_ecdsa_recoverable_signature *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"sigin != NULL");
    ctx_local._4_4_ = 0;
  }
  else {
    secp256k1_ecdsa_recoverable_signature_load
              (ctx,(secp256k1_scalar *)(s.d + 3),(secp256k1_scalar *)local_68,&local_6c,sigin);
    secp256k1_ecdsa_signature_save(sig,(secp256k1_scalar *)(s.d + 3),(secp256k1_scalar *)local_68);
    ctx_local._4_4_ = 1;
  }
  return ctx_local._4_4_;
}

Assistant:

int secp256k1_ecdsa_recoverable_signature_convert(const secp256k1_context* ctx, secp256k1_ecdsa_signature* sig, const secp256k1_ecdsa_recoverable_signature* sigin) {
    secp256k1_scalar r, s;
    int recid;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(sig != NULL);
    ARG_CHECK(sigin != NULL);

    secp256k1_ecdsa_recoverable_signature_load(ctx, &r, &s, &recid, sigin);
    secp256k1_ecdsa_signature_save(sig, &r, &s);
    return 1;
}